

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O0

bool __thiscall QWhatsThisPrivate::eventFilter(QWhatsThisPrivate *this,QObject *o,QEvent *e)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  Type TVar5;
  MouseButton MVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  QEvent *in_RDX;
  CursorShape CVar10;
  QObject *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QKeyEvent *kev;
  bool sentEvent;
  QMouseEvent *me_1;
  QMouseEvent *me;
  bool customWhatsThis;
  QWidget *w;
  QHelpEvent e_2;
  QHelpEvent e_1;
  KeyboardModifier in_stack_fffffffffffffee0;
  WidgetAttribute in_stack_fffffffffffffee4;
  QWidget *in_stack_fffffffffffffee8;
  QFlagsStorage<Qt::KeyboardModifier> lhs;
  bool local_b1;
  QCursor local_b0;
  QPointF local_a8;
  QPoint local_98;
  QPointF local_90;
  QPoint local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  QPointF local_58;
  QPoint local_48;
  QPointF local_40;
  QPoint local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QObject::isWidgetType((QObject *)0x4c3fff);
  if (!bVar2) {
    local_b1 = false;
    goto LAB_004c43f7;
  }
  bVar2 = QWidget::testAttribute(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
  TVar5 = QEvent::type(in_RDX);
  uVar8 = (ulong)(TVar5 - MouseButtonPress);
  switch(uVar8) {
  case 0:
    MVar6 = QSinglePointEvent::button((QSinglePointEvent *)in_RDX);
    if ((MVar6 == RightButton) || (bVar2)) {
      local_b1 = false;
      goto LAB_004c43f7;
    }
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = QSinglePointEvent::position((QSinglePointEvent *)0x4c40cd);
    local_30 = QPointF::toPoint(in_RDI);
    local_58 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x4c40fe);
    local_48 = QPointF::toPoint(in_RDI);
    QHelpEvent::QHelpEvent
              ((QHelpEvent *)&local_28,WhatsThis,(QPoint *)&local_30,(QPoint *)&local_48);
    uVar8 = QCoreApplication::sendEvent(in_RSI,(QEvent *)&local_28);
    if (((uVar8 & 1) == 0) || (bVar2 = QEvent::isAccepted((QEvent *)&local_28), !bVar2)) {
      *(undefined1 *)&in_RDI[2].xp = 1;
    }
    QHelpEvent::~QHelpEvent((QHelpEvent *)&local_28);
    break;
  case 1:
  case 2:
    goto switchD_004c405a_caseD_1;
  case 3:
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = QSinglePointEvent::position((QSinglePointEvent *)0x4c41db);
    local_80 = QPointF::toPoint(in_RDI);
    local_a8 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x4c420c);
    local_98 = QPointF::toPoint(in_RDI);
    QHelpEvent::QHelpEvent
              ((QHelpEvent *)&local_78,QueryWhatsThis,(QPoint *)&local_80,(QPoint *)&local_98);
    bVar3 = QCoreApplication::sendEvent(in_RSI,(QEvent *)&local_78);
    bVar1 = 1;
    if ((bVar3 & 1) != 0) {
      bVar4 = QEvent::isAccepted((QEvent *)&local_78);
      bVar1 = bVar4 ^ 0xff;
    }
    CVar10 = WhatsThisCursor;
    if ((bVar1 & 1) != 0) {
      CVar10 = ForbiddenCursor;
    }
    QCursor::QCursor(&local_b0,CVar10);
    QGuiApplication::changeOverrideCursor(&local_b0);
    QCursor::~QCursor(&local_b0);
    QHelpEvent::~QHelpEvent((QHelpEvent *)&local_78);
switchD_004c405a_caseD_1:
    if ((((ulong)in_RDI[2].xp & 1) != 0) &&
       (TVar5 = QEvent::type(in_RDX), TVar5 == MouseButtonRelease)) {
      QWhatsThis::leaveWhatsThisMode();
    }
    MVar6 = QSinglePointEvent::button((QSinglePointEvent *)in_RDX);
    if ((MVar6 == RightButton) || (bVar2)) {
      local_b1 = false;
      goto LAB_004c43f7;
    }
    break;
  case 4:
    uVar9 = QKeyEvent::matches((StandardKey)in_RDX);
    lhs.i = (Int)(uVar8 >> 0x20);
    if ((uVar9 & 1) != 0) {
      QWhatsThis::leaveWhatsThisMode();
      local_b1 = true;
      goto LAB_004c43f7;
    }
    if (bVar2) {
      local_b1 = false;
      goto LAB_004c43f7;
    }
    iVar7 = QKeyEvent::key((QKeyEvent *)in_RDX);
    if (iVar7 == 0x1000055) {
LAB_004c4393:
      local_b1 = false;
      goto LAB_004c43f7;
    }
    iVar7 = QKeyEvent::key((QKeyEvent *)in_RDX);
    if (iVar7 == 0x1000039) {
      QKeyEvent::modifiers();
      bVar2 = ::operator==((QFlags<Qt::KeyboardModifier>)lhs.i,in_stack_fffffffffffffee0);
      if (bVar2) goto LAB_004c4393;
    }
    iVar7 = QKeyEvent::key((QKeyEvent *)in_RDX);
    if ((((iVar7 != 0x1000020) && (iVar7 = QKeyEvent::key((QKeyEvent *)in_RDX), iVar7 != 0x1000023))
        && (iVar7 = QKeyEvent::key((QKeyEvent *)in_RDX), iVar7 != 0x1000021)) &&
       (iVar7 = QKeyEvent::key((QKeyEvent *)in_RDX), iVar7 != 0x1000022)) {
      QWhatsThis::leaveWhatsThisMode();
    }
    break;
  default:
    local_b1 = false;
    goto LAB_004c43f7;
  }
  local_b1 = true;
LAB_004c43f7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_b1;
}

Assistant:

bool QWhatsThisPrivate::eventFilter(QObject *o, QEvent *e)
{
    if (!o->isWidgetType())
        return false;
    QWidget * w = static_cast<QWidget *>(o);
    bool customWhatsThis = w->testAttribute(Qt::WA_CustomWhatsThis);
    switch (e->type()) {
    case QEvent::MouseButtonPress:
    {
        QMouseEvent *me = static_cast<QMouseEvent*>(e);
        if (me->button() == Qt::RightButton || customWhatsThis)
            return false;
        QHelpEvent e(QEvent::WhatsThis, me->position().toPoint(), me->globalPosition().toPoint());
        if (!QCoreApplication::sendEvent(w, &e) || !e.isAccepted())
            leaveOnMouseRelease = true;

    } break;

    case QEvent::MouseMove:
    {
        QMouseEvent *me = static_cast<QMouseEvent*>(e);
        QHelpEvent e(QEvent::QueryWhatsThis, me->position().toPoint(), me->globalPosition().toPoint());
        const bool sentEvent = QCoreApplication::sendEvent(w, &e);
#ifdef QT_NO_CURSOR
        Q_UNUSED(sentEvent);
#else
        QGuiApplication::changeOverrideCursor((!sentEvent || !e.isAccepted())?
                                              Qt::ForbiddenCursor:Qt::WhatsThisCursor);
#endif
        Q_FALLTHROUGH();
    }
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
        if (leaveOnMouseRelease && e->type() == QEvent::MouseButtonRelease)
            QWhatsThis::leaveWhatsThisMode();
        if (static_cast<QMouseEvent*>(e)->button() == Qt::RightButton || customWhatsThis)
            return false; // ignore RMB release
        break;
    case QEvent::KeyPress:
    {
        QKeyEvent *kev = static_cast<QKeyEvent *>(e);
#if QT_CONFIG(shortcut)
        if (kev->matches(QKeySequence::Cancel)) {
            QWhatsThis::leaveWhatsThisMode();
            return true;
        } else
#endif
          if (customWhatsThis) {
            return false;
        } else if (kev->key() == Qt::Key_Menu ||
                    (kev->key() == Qt::Key_F10 &&
                      kev->modifiers() == Qt::ShiftModifier)) {
            // we don't react to these keys, they are used for context menus
            return false;
        } else if (kev->key() != Qt::Key_Shift && kev->key() != Qt::Key_Alt // not a modifier key
                   && kev->key() != Qt::Key_Control && kev->key() != Qt::Key_Meta) {
            QWhatsThis::leaveWhatsThisMode();
        }
    } break;
    default:
        return false;
    }
    return true;
}